

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O1

LOs __thiscall
Omega_h::get_verts_onto(Omega_h *this,Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs)

{
  int *piVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar3;
  long lVar4;
  IntIterator last;
  int size_in;
  size_t sVar5;
  LOs LVar6;
  Write<int> keys2verts_onto_w;
  type set_key_onto;
  LOs ev2v;
  Write<int> local_118;
  Write<int> local_108;
  Alloc *local_f8;
  pointer local_f0;
  Alloc *local_e8;
  pointer local_e0;
  Alloc *local_d8;
  pointer local_d0;
  Alloc *local_c8;
  element_type *local_c0;
  Alloc *local_b8;
  element_type *local_b0;
  string local_a8;
  Alloc *local_88;
  pointer local_80;
  Alloc *local_78;
  element_type *local_70;
  Alloc *local_68;
  pointer psStack_60;
  Alloc *local_58;
  pointer psStack_50;
  Alloc *local_48;
  pointer psStack_40;
  Alloc *local_38;
  element_type *peStack_30;
  
  pAVar2 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar5 = pAVar2->size;
  }
  else {
    sVar5 = (ulong)pAVar2 >> 3;
  }
  Mesh::ask_verts_of((Mesh *)&local_b8,(Int)mesh);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  size_in = (int)(sVar5 >> 2);
  Write<int>::Write(&local_118,size_in,-1,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  local_f8 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_f0 = (pointer)(rails2edges->write_).shared_alloc_.direct_ptr;
  local_e8 = (rail_col_dirs->write_).shared_alloc_.alloc;
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_e8->size * 8 + 1);
    }
    else {
      local_e8->use_count = local_e8->use_count + 1;
    }
  }
  local_e0 = (pointer)(rail_col_dirs->write_).shared_alloc_.direct_ptr;
  local_d8 = local_118.shared_alloc_.alloc;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)((local_118.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.shared_alloc_.alloc)->use_count = (local_118.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d0 = (pointer)local_118.shared_alloc_.direct_ptr;
  local_c8 = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  local_c0 = local_b0;
  local_68 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_58 = local_e8;
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)(local_e8->size * 8 + 1);
    }
    else {
      local_e8->use_count = local_e8->use_count + 1;
    }
  }
  local_48 = local_d8;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48 = (Alloc *)(local_d8->size * 8 + 1);
    }
    else {
      local_d8->use_count = local_d8->use_count + 1;
    }
  }
  psStack_40 = (pointer)local_118.shared_alloc_.direct_ptr;
  local_38 = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38 = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  peStack_30 = local_b0;
  psStack_60 = local_f0;
  psStack_50 = local_e0;
  if (0 < size_in) {
    local_a8._M_dataplus._M_p = (pointer)local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_68->use_count = local_68->use_count + -1;
      local_a8._M_dataplus._M_p = (pointer)(local_68->size * 8 + 1);
    }
    local_68 = (Alloc *)0x0;
    psStack_60 = (pointer)0x0;
    local_a8.field_2._M_allocated_capacity = (size_type)local_58;
    if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
      local_58->use_count = local_58->use_count + -1;
      local_a8.field_2._M_allocated_capacity = local_58->size * 8 + 1;
    }
    local_58 = (Alloc *)0x0;
    psStack_50 = (pointer)0x0;
    local_88 = local_48;
    local_80 = (pointer)local_118.shared_alloc_.direct_ptr;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      local_48->use_count = local_48->use_count + -1;
      local_88 = (Alloc *)(local_48->size * 8 + 1);
    }
    local_48 = (Alloc *)0x0;
    psStack_40 = (pointer)0x0;
    local_78 = local_38;
    local_70 = local_b0;
    if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
      local_38->use_count = local_38->use_count + -1;
      local_78 = (Alloc *)(local_38->size * 8 + 1);
    }
    local_38 = (Alloc *)0x0;
    peStack_30 = (element_type *)0x0;
    entering_parallel = '\0';
    lVar4 = 0;
    do {
      *(undefined4 *)
       ((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
               local_118.shared_alloc_.direct_ptr)->_M_ptr + lVar4 * 4) =
           *(undefined4 *)
            ((long)&local_b0->library_ +
            (long)((*(int *)((long)&(local_f0->
                                    super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar4 * 4) * 2 + 1) -
                  (int)*(char *)((long)&(local_e0->
                                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + lVar4)) * 4);
      lVar4 = lVar4 + 1;
    } while (size_in != (int)lVar4);
    local_a8._M_string_length = (size_type)local_f0;
    local_a8.field_2._8_8_ = local_e0;
    get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_a8);
  }
  get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_68);
  local_108.shared_alloc_.alloc = local_118.shared_alloc_.alloc;
  local_108.shared_alloc_.direct_ptr = local_118.shared_alloc_.direct_ptr;
  if ((((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
       local_118.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_118.shared_alloc_.alloc)->use_count = (local_118.shared_alloc_.alloc)->use_count + -1;
    local_108.shared_alloc_.alloc = (Alloc *)((local_118.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_118.shared_alloc_.alloc = (Alloc *)0x0;
  local_118.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_108);
  pAVar2 = local_108.shared_alloc_.alloc;
  if (((ulong)local_108.shared_alloc_.alloc & 7) == 0 &&
      local_108.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_108.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_f8);
  pAVar2 = local_118.shared_alloc_.alloc;
  pvVar3 = extraout_RDX;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_118.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar1 = &local_b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(local_b8,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  LVar6.write_.shared_alloc_.direct_ptr = pvVar3;
  LVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar6.write_.shared_alloc_;
}

Assistant:

LOs get_verts_onto(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs) {
  auto nkeys = rails2edges.size();
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto keys2verts_onto_w = Write<LO>(nkeys, -1);
  auto set_key_onto = OMEGA_H_LAMBDA(LO key) {
    auto e = rails2edges[key];
    auto eev = rail_col_dirs[key];
    keys2verts_onto_w[key] = ev2v[e * 2 + (1 - eev)];
  };
  parallel_for(nkeys, set_key_onto, "get_verts_onto");
  return keys2verts_onto_w;
}